

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O2

void apprun_file_copy(char *source_path,char *target_path)

{
  int __c;
  FILE *__stream;
  FILE *__stream_00;
  char *__format;
  
  __stream = fopen(source_path,"r");
  __stream_00 = fopen(target_path,"w");
  if (__stream == (FILE *)0x0) {
    __format = "Unable to read file: %s\n";
    target_path = source_path;
  }
  else {
    if (__stream_00 != (FILE *)0x0) {
      while( true ) {
        __c = fgetc(__stream);
        if (__c == -1) break;
        fputc(__c,__stream_00);
      }
      fclose(__stream);
      fclose(__stream_00);
      return;
    }
    __format = "Unable to write file: %s\n";
  }
  fprintf(_stderr,__format,target_path);
  exit(1);
}

Assistant:

void apprun_file_copy(const char *source_path, const char *target_path) {
    FILE *source, *target;

    source = fopen(source_path, "r");
    target = fopen(target_path, "w");

    if (source == NULL) {
        fprintf(stderr, "Unable to read file: %s\n", source_path);
        exit(1);
    }

    if (target == NULL) {
        fprintf(stderr, "Unable to write file: %s\n", target_path);
        exit(1);
    }


    int ch;
    while ((ch = fgetc(source)) != EOF)
        fputc(ch, target);

    fclose(source);
    fclose(target);
}